

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void basic_suite::test_float(void)

{
  bool bVar1;
  value vVar2;
  int iVar3;
  char input [4];
  reader reader;
  float local_174;
  view_type local_170;
  char local_15c [4];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_15c,"1.0",4);
  local_170._M_len = strlen(local_15c);
  local_170._M_str = local_15c;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_170);
  local_174 = 1.26117e-44;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x82,"void basic_suite::test_float()",&local_170,&local_174);
  local_170._M_len._0_4_ =
       trial::protocol::json::token::symbol::convert(local_158.decoder.current.code);
  local_174 = 7.00649e-45;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","token::symbol::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x83,"void basic_suite::test_float()",&local_170,&local_174);
  vVar2 = trial::protocol::json::basic_reader<char>::category(&local_158);
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,vVar2);
  local_174 = 2.8026e-45;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::category::value,trial::protocol::json::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x84,"void basic_suite::test_float()",&local_170,&local_174);
  local_174 = trial::protocol::json::basic_reader<char>::overloader<float,_void>::value(&local_158);
  local_170._M_len = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,double>
            ("reader.value<float>()","1.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x85,"void basic_suite::test_float()",&local_174,&local_170);
  iVar3 = trial::protocol::json::basic_reader<char>::overloader<int,_void>::value(&local_158);
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,iVar3);
  local_174 = 1.4013e-45;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x86,"void basic_suite::test_float()",&local_170,&local_174);
  local_170._M_len =
       (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
  local_170._M_str = local_158.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[4]>
            ("reader.literal()","\"1.0\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x87,"void basic_suite::test_float()",&local_170,"1.0");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
  local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
  local_174 = (float)((uint)local_174 & 0xffffff00);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x88,"void basic_suite::test_float()",&local_170,&local_174);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_158.stack);
  return;
}

Assistant:

void test_float()
{
    const char input[] = "1.0";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::real);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::real);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<float>(), 1.0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "1.0");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
}